

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

bool __thiscall
SQCompilation::CheckerVisitor::isPotentiallyNullable
          (CheckerVisitor *this,Expr *e,
          unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
          *visited)

{
  TreeOp TVar1;
  int iVar2;
  ValueRefState VVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  _func_int **pp_Var6;
  bool bVar7;
  ValueRef *pVVar8;
  Expr *pEVar9;
  __hash_code __code;
  long lVar10;
  ulong uVar11;
  SQChar *n;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  LiteralExpr *l;
  int32_t dummy;
  Expr *local_38;
  int32_t local_2c;
  
  local_38 = e;
  local_38 = deparen(e);
  uVar4 = (visited->_M_h)._M_bucket_count;
  uVar11 = (ulong)local_38 % uVar4;
  p_Var12 = (visited->_M_h)._M_buckets[uVar11];
  p_Var13 = (__node_base_ptr)0x0;
  if ((p_Var12 != (__node_base_ptr)0x0) &&
     (p_Var5 = p_Var12->_M_nxt, p_Var13 = p_Var12, local_38 != (Expr *)p_Var12->_M_nxt[1]._M_nxt)) {
    while (p_Var12 = p_Var5, p_Var5 = p_Var12->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      p_Var13 = (__node_base_ptr)0x0;
      if (((ulong)p_Var5[1]._M_nxt % uVar4 != uVar11) ||
         (p_Var13 = p_Var12, local_38 == (Expr *)p_Var5[1]._M_nxt)) goto LAB_00158755;
    }
    p_Var13 = (__node_base_ptr)0x0;
  }
LAB_00158755:
  if ((p_Var13 != (__node_base_ptr)0x0) && (p_Var13->_M_nxt != (_Hash_node_base *)0x0)) {
    return false;
  }
  std::
  _Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<SQCompilation::Expr_const*&>
            ((_Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)visited,&local_38);
  pVVar8 = findValueForExpr(this,local_38);
  if (pVVar8 != (ValueRef *)0x0) {
    if ((pVVar8->flagsPositive & 2) != 0) {
      return true;
    }
    if ((pVVar8->flagsNegative & 2) != 0) {
      return false;
    }
    if (pVVar8->state == VRS_UNDEFINED) {
      return true;
    }
    if (pVVar8->state == VRS_PARTIALLY) {
      return true;
    }
  }
  local_2c = -1;
  pEVar9 = maybeEval(this,local_38,&local_2c,false);
  TVar1 = (pEVar9->super_Node)._op;
  if (TVar1 == TO_LITERAL) {
    return *(int *)&(pEVar9->super_Node).field_0x1c == 4;
  }
  if ((TVar1 - TO_GETFIELD < 4) && ((char)pEVar9[1].super_Node._coordinates.lineStart != '\0')) {
    return true;
  }
  local_38 = pEVar9;
  if (TVar1 == TO_NULLC) {
    pEVar9 = *(Expr **)&pEVar9[1].super_Node._coordinates;
    goto LAB_001588b1;
  }
  if (TVar1 == TO_TERNARY) {
    bVar7 = isPotentiallyNullable(this,*(Expr **)&pEVar9[1].super_Node._coordinates,visited);
    if (bVar7) {
      return true;
    }
    pEVar9 = *(Expr **)&pEVar9[1].super_Node._coordinates.lineEnd;
    goto LAB_001588b1;
  }
  if (TVar1 == TO_CALL) {
    if (*(char *)&pEVar9[2].super_Node.super_ArenaObj._vptr_ArenaObj != '\0') {
      return true;
    }
    pp_Var6 = pEVar9[1].super_Node.super_ArenaObj._vptr_ArenaObj;
    iVar2 = *(int *)(pp_Var6 + 3);
    if (iVar2 == 0x11) {
      lVar10 = 0x20;
LAB_00158839:
      n = *(SQChar **)((long)pp_Var6 + lVar10);
    }
    else {
      if (iVar2 == 0x3f) {
        lVar10 = 0x30;
        goto LAB_00158839;
      }
      n = (SQChar *)0x0;
    }
    if ((n != (SQChar *)0x0) && (bVar7 = canFunctionReturnNull(n), bVar7)) {
      return true;
    }
  }
  pVVar8 = findValueForExpr(this,pEVar9);
  if (pVVar8 != (ValueRef *)0x0) {
    VVar3 = pVVar8->state;
    if (VVar3 - VRS_EXPRESSION < 2) {
      pEVar9 = pVVar8->expression;
LAB_001588b1:
      bVar7 = isPotentiallyNullable(this,pEVar9,visited);
      return bVar7;
    }
    if (VVar3 == VRS_UNDEFINED) {
      return true;
    }
    if (VVar3 == VRS_PARTIALLY) {
      return true;
    }
  }
  return false;
}

Assistant:

bool CheckerVisitor::isPotentiallyNullable(const Expr *e, std::unordered_set<const Expr *> &visited) {

  e = deparen(e);

  auto existed = visited.find(e);
  if (existed != visited.end()) {
    return false;
  }

  visited.emplace(e);

  const ValueRef *v = findValueForExpr(e);

  if (v) {
    if (v->flagsPositive & RT_NULL)
      return true;

    if (v->flagsNegative & RT_NULL)
      return false;

    if (v->state == VRS_UNDEFINED || v->state == VRS_PARTIALLY)
      return true;
  }

  e = maybeEval(e);

  if (e->op() == TO_LITERAL) {
    const LiteralExpr *l = e->asLiteral();
    return l->kind() == LK_NULL;
  }

  if (e->isAccessExpr()) {
    if (e->asAccessExpr()->isNullable()) {
      return true;
    }
  }

  if (e->op() == TO_CALL) {
    const CallExpr *call = static_cast<const CallExpr *>(e);
    if (call->isNullable()) {
      return true;
    }

    const SQChar *funcName = nullptr;
    const Expr *callee = call->callee();

    if (callee->op() == TO_ID) {
      funcName = callee->asId()->id();
    }
    else if (callee->op() == TO_GETFIELD) {
      funcName = callee->asGetField()->fieldName();
    }

    if (funcName) {
      if (canFunctionReturnNull(funcName)) {
        return true;
      }
    }
  }

  if (e->op() == TO_NULLC) {
    return isPotentiallyNullable(static_cast<const BinExpr *>(e)->rhs(), visited);
  }

  if (e->op() == TO_TERNARY) {
    const TerExpr *t = static_cast<const TerExpr *>(e);
    return isPotentiallyNullable(t->b(), visited) || isPotentiallyNullable(t->c(), visited);
  }

  v = findValueForExpr(e);

  if (v) {
    switch (v->state)
    {
    case VRS_EXPRESSION:
    case VRS_INITIALIZED:
      return isPotentiallyNullable(v->expression, visited);
    case VRS_UNDEFINED:
    case VRS_PARTIALLY:
      return true;
    default:
      return false;
    }
  }

  return false;
}